

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnIndex(Table *pTab,char *zCol)

{
  byte *pbVar1;
  u8 uVar2;
  byte bVar3;
  int iVar4;
  Column *pCVar5;
  long lVar6;
  
  if ((zCol == (char *)0x0) || (bVar3 = *zCol, bVar3 == 0)) {
    uVar2 = '\0';
  }
  else {
    pbVar1 = (byte *)(zCol + 1);
    uVar2 = '\0';
    do {
      uVar2 = uVar2 + ""[bVar3];
      bVar3 = *pbVar1;
      pbVar1 = pbVar1 + 1;
    } while (bVar3 != 0);
  }
  if (0 < pTab->nCol) {
    pCVar5 = pTab->aCol;
    iVar4 = 0;
    do {
      if (pCVar5->hName == uVar2) {
        lVar6 = 0;
        do {
          bVar3 = pCVar5->zCnName[lVar6];
          if (bVar3 == zCol[lVar6]) {
            if ((ulong)bVar3 == 0) {
              return iVar4;
            }
          }
          else if (""[bVar3] != ""[(byte)zCol[lVar6]]) break;
          lVar6 = lVar6 + 1;
        } while( true );
      }
      pCVar5 = pCVar5 + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 != pTab->nCol);
  }
  return -1;
}

Assistant:

SQLITE_PRIVATE u8 sqlite3StrIHash(const char *z){
  u8 h = 0;
  if( z==0 ) return 0;
  while( z[0] ){
    h += UpperToLower[(unsigned char)z[0]];
    z++;
  }
  return h;
}